

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
MDIOSimulationDataGenerator::CreateBit(MDIOSimulationDataGenerator *this,BitState bit_state)

{
  uint uVar1;
  
  SimulationChannelDescriptor::TransitionIfNeeded((BitState)this->mMdio);
  uVar1 = (int)this + 0x18;
  ClockGenerator::AdvanceByHalfPeriod(0.5);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(1.0);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByHalfPeriod(0.5);
  SimulationChannelDescriptorGroup::AdvanceAll(uVar1);
  return;
}

Assistant:

void MDIOSimulationDataGenerator::CreateBit( BitState bit_state )
{
    mMdio->TransitionIfNeeded( bit_state );
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 0.5 ) );
    mMdc->Transition(); // MDC posedge
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 1.0 ) );
    mMdc->Transition(); // MDC negedge
    mSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 0.5 ) );
}